

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

HttpResponse * asl::Http::request(HttpResponse *__return_storage_ptr__,HttpRequest *request)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  String *pSVar5;
  ByteArray *pBVar6;
  ulong uVar7;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  void *__buf;
  int *this;
  Shared<asl::HttpSink> *s;
  String local_3b0;
  int local_394;
  int n;
  Progress progress;
  HttpRequest req;
  undefined1 local_220 [8];
  String loc;
  int code;
  undefined1 local_1e8 [8];
  Array<asl::String> parts;
  undefined1 local_1c8 [8];
  String line;
  undefined1 local_198 [8];
  String title;
  String local_168;
  String local_150;
  Socket local_138;
  undefined4 local_12c;
  String local_128;
  byte local_109;
  undefined1 local_108 [7];
  bool hasPort;
  Url url;
  undefined1 local_a8 [8];
  HttpResponse response;
  Socket socket;
  HttpRequest *request_local;
  
  Socket::Socket((Socket *)&response._code,(SmartObject_ *)0x0);
  HttpResponse::HttpResponse((HttpResponse *)local_a8,request);
  HttpResponse::setCode((HttpResponse *)local_a8,0);
  pSVar5 = HttpRequest::url(request);
  Url::Url((Url *)local_108,pSVar5);
  local_109 = url.path.field_2._8_4_ != 0;
  bVar1 = asl::String::operator==((String *)local_108,"https");
  if (bVar1) {
    asl::String::String(&local_128,"SOCKET_NO_TLS_AVAILABLE");
    HttpMessage::setSockError((HttpMessage *)local_a8,&local_128);
    asl::String::~String(&local_128);
    HttpResponse::HttpResponse(__return_storage_ptr__,(HttpResponse *)local_a8);
    local_12c = 1;
  }
  else {
    Socket::Socket(&local_138);
    Socket::operator=((Socket *)&response._code,&local_138);
    Socket::~Socket(&local_138);
    if ((local_109 & 1) == 0) {
      url.path.field_2._8_4_ = 0x50;
    }
    HttpMessage::use((HttpMessage *)local_a8,(Socket *)&response._code);
    HttpMessage::use(&request->super_HttpMessage,(Socket *)&response._code);
    iVar3 = (int)&url + 0x10;
    uVar2 = Socket::connect((Socket *)&response._code,iVar3,
                            (sockaddr *)(ulong)(uint)url.path.field_2._8_4_,in_ECX);
    if ((uVar2 & 1) == 0) {
      Socket::close((Socket *)&response._code,iVar3);
      Socket::errorMsg(&local_150,(Socket *)&response._code);
      HttpMessage::setSockError((HttpMessage *)local_a8,&local_150);
      asl::String::~String(&local_150);
      HttpResponse::HttpResponse(__return_storage_ptr__,(HttpResponse *)local_a8);
      local_12c = 1;
    }
    else {
      pBVar6 = HttpMessage::body(&request->super_HttpMessage);
      iVar3 = Array<unsigned_char>::length(pBVar6);
      if (iVar3 != 0) {
        asl::String::String(&local_168,"Content-Length");
        pBVar6 = HttpMessage::body(&request->super_HttpMessage);
        iVar3 = Array<unsigned_char>::length(pBVar6);
        asl::String::String((String *)((long)&title.field_2 + 8),iVar3);
        HttpMessage::setHeader
                  (&request->super_HttpMessage,&local_168,(String *)((long)&title.field_2 + 8));
        asl::String::~String((String *)((long)&title.field_2 + 8));
        asl::String::~String(&local_168);
      }
      asl::String::String((String *)local_198);
      pSVar5 = HttpRequest::method(request);
      pSVar5 = asl::String::operator<<((String *)local_198,pSVar5);
      pSVar5 = asl::String::operator<<(pSVar5,' ');
      pSVar5 = asl::String::operator<<(pSVar5,(String *)((long)&url.host.field_2 + 8));
      pSVar5 = asl::String::operator<<(pSVar5," HTTP/1.1\r\nHost: ");
      asl::String::operator<<(pSVar5,(String *)((long)&url.protocol.field_2 + 8));
      if ((local_109 & 1) != 0) {
        pSVar5 = asl::String::operator<<((String *)local_198,':');
        asl::String::operator<<(pSVar5,(int *)(url.path.field_2._space + 8));
      }
      pSVar5 = (String *)local_198;
      asl::String::operator=((String *)request,pSVar5);
      uVar7 = HttpMessage::write(&request->super_HttpMessage,(int)pSVar5,__buf,
                                 CONCAT44(in_register_0000000c,in_ECX));
      if ((uVar7 & 1) == 0) {
        Socket::errorMsg((String *)((long)&line.field_2 + 8),(Socket *)&response._code);
        HttpMessage::setSockError((HttpMessage *)local_a8,(String *)((long)&line.field_2 + 8));
        asl::String::~String((String *)((long)&line.field_2 + 8));
        HttpResponse::HttpResponse(__return_storage_ptr__,(HttpResponse *)local_a8);
        local_12c = 1;
      }
      else {
        this = &response._code;
        Socket::readLine((String *)local_1c8,(Socket *)this);
        iVar3 = (int)this;
        bVar1 = asl::String::ok((String *)local_1c8);
        if (bVar1) {
          iVar3 = (int)local_1c8;
          asl::String::split((String *)local_1e8);
          iVar4 = Array<asl::String>::length((Array<asl::String> *)local_1e8);
          if (iVar4 < 2) {
            Socket::close((Socket *)&response._code,iVar3);
            Socket::errorMsg((String *)&stack0xfffffffffffffe00,(Socket *)&response._code);
            HttpMessage::setSockError((HttpMessage *)local_a8,(String *)&stack0xfffffffffffffe00);
            asl::String::~String((String *)&stack0xfffffffffffffe00);
            HttpResponse::HttpResponse(__return_storage_ptr__,(HttpResponse *)local_a8);
            local_12c = 1;
          }
          else {
            pSVar5 = Array<asl::String>::operator[]((Array<asl::String> *)local_1e8,0);
            HttpResponse::setProto((HttpResponse *)local_a8,pSVar5);
            pSVar5 = Array<asl::String>::operator[]((Array<asl::String> *)local_1e8,1);
            iVar3 = asl::String::operator_cast_to_int(pSVar5);
            HttpResponse::setCode((HttpResponse *)local_a8,iVar3);
            HttpMessage::readHeaders((HttpMessage *)local_a8);
            loc.field_2._12_4_ = HttpResponse::code((HttpResponse *)local_a8);
            bVar1 = HttpRequest::followRedirects(request);
            if ((bVar1) &&
               ((((loc.field_2._12_4_ == 0x12d || (loc.field_2._12_4_ == 0x12e)) ||
                 (loc.field_2._12_4_ == 0x133)) || (loc.field_2._12_4_ == 0x134)))) {
              Socket::close((Socket *)&response._code,iVar3);
              asl::String::String((String *)&req._recursion,"Location");
              HttpMessage::header((String *)local_220,(HttpMessage *)local_a8,
                                  (String *)&req._recursion);
              asl::String::~String((String *)&req._recursion);
              HttpRequest::HttpRequest((HttpRequest *)&progress,request);
              HttpRequest::setUrl((HttpRequest *)&progress,(String *)local_220);
              Function<void,_const_asl::HttpStatus_&,_asl::NoType>::Function
                        ((Function<void,_const_asl::HttpStatus_&,_asl::NoType> *)
                         &stack0xfffffffffffffc70,
                         (Function<void,_const_asl::HttpStatus_&,_asl::NoType> *)
                         &req.super_HttpMessage._socket);
              HttpMessage::onProgress
                        ((HttpMessage *)&progress,
                         (Function<void,_const_asl::HttpStatus_&,_asl::NoType> *)
                         &stack0xfffffffffffffc70);
              local_394 = HttpRequest::recursion(request);
              local_394 = local_394 + 1;
              if (local_394 < 4) {
                HttpRequest::setRecursion((HttpRequest *)&progress,local_394);
                Http::request(__return_storage_ptr__,(HttpRequest *)&progress);
              }
              else {
                HttpResponse::setCode((HttpResponse *)local_a8,0x1a5);
                asl::String::String(&local_3b0,"Too many redirects");
                HttpMessage::setSockError((HttpMessage *)local_a8,&local_3b0);
                asl::String::~String(&local_3b0);
                HttpResponse::HttpResponse(__return_storage_ptr__,(HttpResponse *)local_a8);
              }
              local_12c = 1;
              Function<void,_const_asl::HttpStatus_&,_asl::NoType>::~Function
                        ((Function<void,_const_asl::HttpStatus_&,_asl::NoType> *)
                         &stack0xfffffffffffffc70);
              HttpRequest::~HttpRequest((HttpRequest *)&progress);
              asl::String::~String((String *)local_220);
            }
            else {
              HttpMessage::onProgress
                        ((HttpMessage *)local_a8,&(request->super_HttpMessage)._progress);
              s = &(request->super_HttpMessage)._sink;
              HttpMessage::useSink((HttpMessage *)local_a8,s);
              iVar3 = (int)s;
              HttpMessage::readBody((HttpMessage *)local_a8);
              Socket::close((Socket *)&response._code,iVar3);
              HttpResponse::HttpResponse(__return_storage_ptr__,(HttpResponse *)local_a8);
              local_12c = 1;
            }
          }
          Array<asl::String>::~Array((Array<asl::String> *)local_1e8);
        }
        else {
          Socket::close((Socket *)&response._code,iVar3);
          Socket::errorMsg((String *)&parts,(Socket *)&response._code);
          HttpMessage::setSockError((HttpMessage *)local_a8,(String *)&parts);
          asl::String::~String((String *)&parts);
          HttpResponse::HttpResponse(__return_storage_ptr__,(HttpResponse *)local_a8);
          local_12c = 1;
        }
        asl::String::~String((String *)local_1c8);
      }
      asl::String::~String((String *)local_198);
    }
  }
  Url::~Url((Url *)local_108);
  HttpResponse::~HttpResponse((HttpResponse *)local_a8);
  Socket::~Socket((Socket *)&response._code);
  return __return_storage_ptr__;
}

Assistant:

HttpResponse Http::request(HttpRequest& request)
{
	Socket socket((Socket::Ptr)NULL);
	HttpResponse response(request);
	response.setCode(0);

	Url url(request.url());
	bool hasPort = url.port != 0;

	if (url.protocol == "https")
	{
#ifdef ASL_TLS
		socket = TlsSocket();
		if (!hasPort) url.port = 443;
#else
		response.setSockError("SOCKET_NO_TLS_AVAILABLE");
		return response;
#endif
	}
	else {
		socket = Socket();
		if (!hasPort) url.port = 80;
	}

	response.use(socket);
	request.use(socket);

	if (!socket.connect(url.host, url.port)) {
		//printf("Cannot connect to %s : %i\n", *url.host, url.port);
		socket.close();
		response.setSockError(socket.errorMsg());
		return response;
	}
	
	if (request.body().length() != 0) {
		request.setHeader("Content-Length", request.body().length());
	}

	String title;
	title << request.method() << ' ' << url.path << " HTTP/1.1\r\nHost: " << url.host;
	if (hasPort)
		title << ':' << url.port;
	request._command = title;

	if (!request.write())
	{
		response.setSockError(socket.errorMsg());
		return response;
	}
	
	String line = socket.readLine();
	if (!line.ok()) {
		socket.close();
		response.setSockError(socket.errorMsg());
		return response;
	}
	Array<String> parts = line.split();
	if (parts.length() < 2) {
		socket.close();
		response.setSockError(socket.errorMsg());
		return response;
	}

	response.setProto(parts[0]);
	response.setCode(parts[1]);
	response.readHeaders();

	int code = response.code();

	if (request.followRedirects() && (code == 301 || code == 302 || code == 307 || code == 308)) // 303 ?
	{
		socket.close();
		String loc = response.header("Location");
		HttpRequest req(request);
		req.setUrl(loc);
		Http::Progress progress = req._progress;
		req.onProgress(progress);
		int n = request.recursion() + 1;
		if (n < 4) {
			req.setRecursion(n);
			return Http::request(req);
		}
		else {
			response.setCode(421);
			response.setSockError("Too many redirects");
			return response;
		}
	}

	response.onProgress(request._progress);
	response.useSink(request._sink);

	response.readBody();

	socket.close();
	return response;
}